

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O3

Vec_Str_t * Scl_LibertyReadGenlibStr(Scl_Tree_t *p,int fVerbose)

{
  size_t sVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Vec_Str_t *pVVar6;
  char *pcVar7;
  char *pcVar8;
  int i_1;
  Scl_Item_t *pPin;
  int i;
  long lVar9;
  Scl_Item_t *pCell;
  int i_2;
  
  pVVar6 = (Vec_Str_t *)malloc(0x10);
  pVVar6->nCap = 1000;
  pVVar6->nSize = 0;
  pcVar7 = (char *)malloc(1000);
  pVVar6->pArray = pcVar7;
  iVar5 = 0;
  lVar9 = 0;
  while( true ) {
    cVar2 = "GATE          _const0_  0.000000  z=CONST0;\n"[lVar9];
    if (iVar5 == pVVar6->nCap) {
      if (iVar5 < 0x10) {
        if (pVVar6->pArray == (char *)0x0) {
          pcVar7 = (char *)malloc(0x10);
        }
        else {
          pcVar7 = (char *)realloc(pVVar6->pArray,0x10);
        }
        pVVar6->pArray = pcVar7;
        pVVar6->nCap = 0x10;
      }
      else {
        uVar3 = iVar5 * 2;
        if (pVVar6->pArray == (char *)0x0) {
          pcVar7 = (char *)malloc((ulong)uVar3);
        }
        else {
          pcVar7 = (char *)realloc(pVVar6->pArray,(ulong)uVar3);
        }
        pVVar6->pArray = pcVar7;
        pVVar6->nCap = uVar3;
      }
    }
    else {
      pcVar7 = pVVar6->pArray;
    }
    pVVar6->nSize = iVar5 + 1;
    pcVar7[iVar5] = cVar2;
    if (lVar9 == 0x2b) break;
    iVar5 = pVVar6->nSize;
    lVar9 = lVar9 + 1;
  }
  lVar9 = 0;
  do {
    cVar2 = "GATE          _const1_  0.000000  z=CONST1;\n"[lVar9];
    uVar3 = pVVar6->nSize;
    if (uVar3 == pVVar6->nCap) {
      if ((int)uVar3 < 0x10) {
        if (pVVar6->pArray == (char *)0x0) {
          pcVar7 = (char *)malloc(0x10);
        }
        else {
          pcVar7 = (char *)realloc(pVVar6->pArray,0x10);
        }
        pVVar6->pArray = pcVar7;
        pVVar6->nCap = 0x10;
      }
      else {
        sVar1 = (ulong)uVar3 * 2;
        if (pVVar6->pArray == (char *)0x0) {
          pcVar7 = (char *)malloc(sVar1);
        }
        else {
          pcVar7 = (char *)realloc(pVVar6->pArray,sVar1);
        }
        pVVar6->pArray = pcVar7;
        pVVar6->nCap = (int)sVar1;
      }
    }
    else {
      pcVar7 = pVVar6->pArray;
    }
    pVVar6->nSize = uVar3 + 1;
    pcVar7[(int)uVar3] = cVar2;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x2c);
  uVar3 = p->pItems->Child;
  if (p->nItems <= (int)uVar3) {
LAB_003d045a:
    __assert_fail("v < p->nItems",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                  ,0x4c,"Scl_Item_t *Scl_LibertyItem(Scl_Tree_t *, int)");
  }
  if (-1 < (int)uVar3) {
    pCell = p->pItems + uVar3;
    do {
      iVar5 = (pCell->Key).Beg;
      iVar4 = (pCell->Key).End - iVar5;
      iVar5 = strncmp(p->pContents + iVar5,"cell",(long)iVar4);
      if (iVar4 == 4 && iVar5 == 0) {
        iVar5 = Scl_LibertyReadCellIsFlop(p,pCell);
        if (iVar5 == 0) {
          iVar5 = Scl_LibertyReadCellIsThreeState(p,pCell);
          if (iVar5 == 0) {
            iVar5 = Scl_LibertyReadCellOutputNum(p,pCell);
            if (iVar5 != 0) {
              uVar3 = pCell->Child;
              if ((int)uVar3 < p->nItems) {
                if ((-1 < (int)uVar3) && (p->pItems != (Scl_Item_t *)0x0)) {
                  pPin = p->pItems + uVar3;
                  do {
                    iVar5 = (pPin->Key).Beg;
                    iVar4 = (pPin->Key).End - iVar5;
                    iVar5 = strncmp(p->pContents + iVar5,"pin",(long)iVar4);
                    if (iVar4 == 3 && iVar5 == 0) {
                      Scl_LibertyReadPinFormula(p,pPin);
                    }
                    uVar3 = pPin->Next;
                    if (p->nItems <= (int)uVar3) goto LAB_003d045a;
                  } while ((-1 < (int)uVar3) &&
                          (pPin = p->pItems + uVar3, p->pItems != (Scl_Item_t *)0x0));
                }
                goto LAB_003d0263;
              }
              goto LAB_003d045a;
            }
            pcVar7 = "Scl_LibertyReadGenlib() skipped cell \"%s\" without logic function.\n";
          }
          else {
            pcVar7 = "Scl_LibertyReadGenlib() skipped three-state cell \"%s\".\n";
          }
        }
        else {
          pcVar7 = "Scl_LibertyReadGenlib() skipped sequential cell \"%s\".\n";
        }
        if (fVerbose != 0) {
          pcVar8 = Scl_LibertyReadString(p,pCell->Head);
          printf(pcVar7,pcVar8);
        }
      }
LAB_003d0263:
      uVar3 = pCell->Next;
      if (p->nItems <= (int)uVar3) goto LAB_003d045a;
    } while ((-1 < (int)uVar3) && (pCell = p->pItems + uVar3, p->pItems != (Scl_Item_t *)0x0));
  }
  lVar9 = 0;
  do {
    cVar2 = "\n.end\n"[lVar9];
    uVar3 = pVVar6->nSize;
    if (uVar3 == pVVar6->nCap) {
      if ((int)uVar3 < 0x10) {
        if (pVVar6->pArray == (char *)0x0) {
          pcVar7 = (char *)malloc(0x10);
        }
        else {
          pcVar7 = (char *)realloc(pVVar6->pArray,0x10);
        }
        pVVar6->pArray = pcVar7;
        pVVar6->nCap = 0x10;
      }
      else {
        sVar1 = (ulong)uVar3 * 2;
        if (pVVar6->pArray == (char *)0x0) {
          pcVar7 = (char *)malloc(sVar1);
        }
        else {
          pcVar7 = (char *)realloc(pVVar6->pArray,sVar1);
        }
        pVVar6->pArray = pcVar7;
        pVVar6->nCap = (int)sVar1;
      }
    }
    else {
      pcVar7 = pVVar6->pArray;
    }
    pVVar6->nSize = uVar3 + 1;
    pcVar7[(int)uVar3] = cVar2;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 6);
  uVar3 = pVVar6->nSize;
  if (uVar3 == pVVar6->nCap) {
    if ((int)uVar3 < 0x10) {
      if (pVVar6->pArray == (char *)0x0) {
        pcVar7 = (char *)malloc(0x10);
      }
      else {
        pcVar7 = (char *)realloc(pVVar6->pArray,0x10);
      }
      pVVar6->pArray = pcVar7;
      pVVar6->nCap = 0x10;
    }
    else {
      sVar1 = (ulong)uVar3 * 2;
      if (pVVar6->pArray == (char *)0x0) {
        pcVar7 = (char *)malloc(sVar1);
      }
      else {
        pcVar7 = (char *)realloc(pVVar6->pArray,sVar1);
      }
      pVVar6->pArray = pcVar7;
      pVVar6->nCap = (int)sVar1;
    }
  }
  else {
    pcVar7 = pVVar6->pArray;
  }
  pVVar6->nSize = uVar3 + 1;
  pcVar7[(int)uVar3] = '\0';
  return pVVar6;
}

Assistant:

Vec_Str_t * Scl_LibertyReadGenlibStr( Scl_Tree_t * p, int fVerbose )
{
    Vec_Str_t * vStr;
    Scl_Item_t * pCell, * pOutput, * pInput;
    char * pFormula;
    vStr = Vec_StrAlloc( 1000 );
    Vec_StrPrintStr( vStr, "GATE          _const0_  0.000000  z=CONST0;\n" );
    Vec_StrPrintStr( vStr, "GATE          _const1_  0.000000  z=CONST1;\n" );
    Scl_ItemForEachChildName( p, Scl_LibertyRoot(p), pCell, "cell" )
    {
        if ( Scl_LibertyReadCellIsFlop(p, pCell) )
        {
            if ( fVerbose )  printf( "Scl_LibertyReadGenlib() skipped sequential cell \"%s\".\n", Scl_LibertyReadString(p, pCell->Head) );
            continue;
        }
        if ( Scl_LibertyReadCellIsThreeState(p, pCell) )
        {
            if ( fVerbose )  printf( "Scl_LibertyReadGenlib() skipped three-state cell \"%s\".\n", Scl_LibertyReadString(p, pCell->Head) );
            continue;
        }
        if ( Scl_LibertyReadCellOutputNum(p, pCell) == 0 )
        {
            if ( fVerbose )  printf( "Scl_LibertyReadGenlib() skipped cell \"%s\" without logic function.\n", Scl_LibertyReadString(p, pCell->Head) );
            continue;
        }
        // iterate through output pins
        Scl_ItemForEachChildName( p, pCell, pOutput, "pin" )
        {
            if ( (pFormula = Scl_LibertyReadPinFormula(p, pOutput)) ) 
                continue;
            if ( !strcmp(pFormula, "0") || !strcmp(pFormula, "1") )
            {
                if ( fVerbose ) printf( "Scl_LibertyReadGenlib() skipped cell \"%s\" with constant formula \"%s\".\n", Scl_LibertyReadString(p, pCell->Head), pFormula );
                break;
            }
            Vec_StrPrintStr( vStr, "GATE " );
            Vec_StrPrintStr( vStr, Scl_LibertyReadString(p, pCell->Head) );
            Vec_StrPrintStr( vStr, " " );
            Vec_StrPrintStr( vStr, Scl_LibertyReadCellArea(p, pCell) );
            Vec_StrPrintStr( vStr, " " );
            Vec_StrPrintStr( vStr, Scl_LibertyReadString(p, pOutput->Head) );
            Vec_StrPrintStr( vStr, "=" );
            Vec_StrPrintStr( vStr, pFormula );
            Vec_StrPrintStr( vStr, ";\n" );
            // iterate through input pins
            Scl_ItemForEachChildName( p, pCell, pInput, "pin" )
            {
                if ( Scl_LibertyReadPinFormula(p, pInput) == NULL )
                    continue;
                Vec_StrPrintStr( vStr, "  PIN " );
                Vec_StrPrintStr( vStr, Scl_LibertyReadString(p, pInput->Head) );
                Vec_StrPrintStr( vStr, " UNKNOWN  1  999  1.00  0.00  1.00  0.00\n" );
            }
        }
    }
    Vec_StrPrintStr( vStr, "\n.end\n" );
    Vec_StrPush( vStr, '\0' );
//    printf( "%s", Vec_StrArray(vStr) );
    return vStr;
}